

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_test.cc
# Opt level: O1

void __thiscall
bssl::anon_unknown_0::VectorTest_VectorContainingVectors_Test::TestBody
          (VectorTest_VectorContainingVectors_Test *this)

{
  TagAndArray *pTVar1;
  size_t sVar2;
  bool bVar3;
  pointer *__ptr_2;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var4;
  pointer *__ptr;
  long *plVar5;
  char *pcVar6;
  char *in_R9;
  long *plVar7;
  TagAndArray *lhs;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  Vector<TagAndArray> vec_moved;
  size_t count;
  TagAndArray extra;
  AssertionResult gtest_ar_4;
  Vector<TagAndArray> vec;
  TagAndArray elem;
  undefined1 local_2b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  undefined1 local_298 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  Vector<TagAndArray> local_278;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_260;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_258;
  Vector<unsigned_long> local_250;
  internal local_238 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_230;
  Vector<TagAndArray> local_228;
  ios_base *local_208;
  TagAndArray local_200;
  TagAndArray *local_1e0;
  undefined1 local_1d8 [8];
  undefined1 local_1d0 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_1c8 [7];
  ios_base local_158 [264];
  TagAndArray local_50;
  
  local_228.data_ = (TagAndArray *)0x0;
  local_228.size_ = 0;
  local_228.capacity_ = 0;
  plVar5 = (long *)0x0;
  do {
    local_1d0 = (undefined1  [8])0x0;
    aaStack_1c8[0]._M_allocated_capacity = 0;
    aaStack_1c8[0]._8_8_ = 0;
    local_1d8 = (undefined1  [8])plVar5;
    if (plVar5 != (long *)0x0) {
      plVar7 = (long *)0x0;
      do {
        bVar3 = Vector<unsigned_long>::MaybeGrow((Vector<unsigned_long> *)local_1d0);
        if (bVar3) {
          *(long **)((long)local_1d0 + aaStack_1c8[0]._0_8_ * 8) = plVar7;
          aaStack_1c8[0]._0_8_ = aaStack_1c8[0]._M_allocated_capacity + 1;
        }
        else {
          local_298._0_4_ = local_298._0_4_ & 0xffffff00;
          local_290 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          testing::Message::Message((Message *)&local_258);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_2b8,(internal *)local_298,(AssertionResult *)"elem.vec.Push(j)"
                     ,"false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_278,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
                     ,0x76,(char *)local_2b8);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_278,(Message *)&local_258);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_278);
          if (local_2b8 != (undefined1  [8])&local_2a8) {
            operator_delete((void *)local_2b8,local_2a8._M_allocated_capacity + 1);
          }
          if (local_258._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_258._M_head_impl + 8))();
          }
          if (local_290 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_290,local_290);
          }
          if (!bVar3) {
            OPENSSL_free((void *)local_1d0);
            goto LAB_00326966;
          }
        }
        plVar7 = (long *)((long)plVar7 + 1);
      } while (plVar5 != plVar7);
    }
    local_200.tag = (size_t)local_1d8;
    local_200.vec.data_ = (unsigned_long *)0x0;
    local_200.vec.size_ = 0;
    local_200.vec.capacity_ = 0;
    OPENSSL_free((void *)0x0);
    local_200.vec.capacity_ = aaStack_1c8[0]._8_8_;
    local_200.vec.data_ = (unsigned_long *)local_1d0;
    local_200.vec.size_ = aaStack_1c8[0]._M_allocated_capacity;
    local_1d0 = (undefined1  [8])0x0;
    aaStack_1c8[0]._M_allocated_capacity = 0;
    aaStack_1c8[0]._8_8_ = 0;
    bVar3 = Vector<TagAndArray>::Push(&local_228,&local_200);
    local_298[0] = (internal)bVar3;
    local_290 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    OPENSSL_free(local_200.vec.data_);
    local_200.vec.data_ = (unsigned_long *)0x0;
    local_200.vec.size_ = 0;
    local_200.vec.capacity_ = 0;
    if (local_298[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_258);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_2b8,(internal *)local_298,
                 (AssertionResult *)"vec.Push(std::move(elem))","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_278,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
                 ,0x78,(char *)local_2b8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_278,(Message *)&local_258);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_278);
      if (local_2b8 != (undefined1  [8])&local_2a8) {
        operator_delete((void *)local_2b8,local_2a8._M_allocated_capacity + 1);
      }
      if (local_258._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_258._M_head_impl + 8))();
      }
      if (local_290 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_290,local_290);
      }
      OPENSSL_free((void *)local_1d0);
LAB_00326966:
      local_1d0 = (undefined1  [8])0x0;
      aaStack_1c8[0]._M_allocated_capacity = 0;
      aaStack_1c8[0]._8_8_ = 0;
      goto LAB_00326974;
    }
    if (local_290 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_290,local_290);
    }
    OPENSSL_free((void *)local_1d0);
    local_1d0 = (undefined1  [8])0x0;
    aaStack_1c8[0]._M_allocated_capacity = 0;
    aaStack_1c8[0]._8_8_ = 0;
    plVar5 = (long *)((long)plVar5 + 1);
  } while (plVar5 != (long *)0x64);
  local_2b8 = (undefined1  [8])local_228.size_;
  local_298._0_4_ = 100;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)local_1d8,"vec.size()","100u",(unsigned_long *)local_2b8,(uint *)local_298)
  ;
  if (local_1d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2b8);
    if (local_1d0 == (undefined1  [8])0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((_Alloc_hider *)local_1d0)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
               ,0x7a,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_298,(Message *)local_2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_298);
    if (local_2b8 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_2b8 + 8))();
    }
  }
  if (local_1d0 != (undefined1  [8])0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_1d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0);
  }
  local_250.data_ = (unsigned_long *)0x0;
  local_250.size_ = 0;
  local_250.capacity_ = 0;
  local_258._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4d2;
  bVar3 = Vector<unsigned_long>::MaybeGrow(&local_250);
  if (bVar3) {
    local_250.data_[local_250.size_] = 0x4d2;
    local_250.size_ = local_250.size_ + 1;
  }
  local_2b8[0] = (internal)bVar3;
  local_2b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)local_298);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1d8,(internal *)local_2b8,(AssertionResult *)"extra.vec.Push(1234)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_278,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
               ,0x7f,(char *)local_1d8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_278,(Message *)local_298);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_278);
    if (local_1d8 != (undefined1  [8])(local_1d0 + 8)) {
      operator_delete((void *)local_1d8,aaStack_1c8[0]._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_298._4_4_,local_298._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_298._4_4_,local_298._0_4_) + 8))();
    }
    if (local_2b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_2b0,local_2b0);
    }
    if (!bVar3) goto LAB_0032746b;
  }
  local_50.tag = (size_t)local_258._M_head_impl;
  local_50.vec.data_ = (unsigned_long *)0x0;
  local_50.vec.size_ = 0;
  local_50.vec.capacity_ = 0;
  OPENSSL_free((void *)0x0);
  local_50.vec.capacity_ = local_250.capacity_;
  local_50.vec.data_ = local_250.data_;
  local_50.vec.size_ = local_250.size_;
  local_250.data_ = (unsigned_long *)0x0;
  local_250.size_ = 0;
  local_250.capacity_ = 0;
  bVar3 = Vector<TagAndArray>::Push(&local_228,&local_50);
  local_2b8[0] = (internal)bVar3;
  local_2b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  OPENSSL_free(local_50.vec.data_);
  local_50.vec.data_ = (unsigned_long *)0x0;
  local_50.vec.size_ = 0;
  local_50.vec.capacity_ = 0;
  if (local_2b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_298);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1d8,(internal *)local_2b8,
               (AssertionResult *)"vec.Push(std::move(extra))","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_278,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
               ,0x80,(char *)local_1d8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_278,(Message *)local_298);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_278);
    if (local_1d8 != (undefined1  [8])(local_1d0 + 8)) {
      operator_delete((void *)local_1d8,aaStack_1c8[0]._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_298._4_4_,local_298._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_298._4_4_,local_298._0_4_) + 8))();
    }
    if (local_2b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_2b0,local_2b0);
    }
  }
  else {
    if (local_2b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_2b0,local_2b0);
    }
    sVar2 = local_228.size_;
    local_2b8 = (undefined1  [8])local_228.size_;
    local_298._0_4_ = 0x65;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
              ((internal *)local_1d8,"vec.size()","101u",(unsigned_long *)local_2b8,
               (uint *)local_298);
    if (local_1d8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_2b8);
      if (local_1d0 == (undefined1  [8])0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = ((_Alloc_hider *)local_1d0)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_298,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
                 ,0x81,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_298,(Message *)local_2b8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_298);
      if (local_2b8 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_2b8 + 8))();
      }
    }
    if (local_1d0 != (undefined1  [8])0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_1d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0);
    }
    lhs = local_228.data_;
    if ((__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )sVar2 ==
        (__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
LAB_00327489:
      abort();
    }
    Vector<unsigned_long>::~Vector(&local_228.data_[sVar2 + -1].vec);
    _Var4._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(sVar2 + -1);
    local_298._0_4_ = 100;
    local_2b8 = (undefined1  [8])
                _Var4._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl;
    local_228.size_ =
         (size_t)_Var4._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
              ((internal *)local_1d8,"vec.size()","100u",(unsigned_long *)local_2b8,
               (uint *)local_298);
    if (local_1d8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_2b8);
      if (local_1d0 == (undefined1  [8])0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = ((_Alloc_hider *)local_1d0)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_298,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
                 ,0x83,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_298,(Message *)local_2b8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_298);
      if (local_2b8 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_2b8 + 8))();
      }
    }
    if (local_1d0 != (undefined1  [8])0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_1d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0);
    }
    local_278.data_ = (TagAndArray *)0x0;
    local_278.size_ = 0;
    local_278.capacity_ = 0;
    Vector<TagAndArray>::clear(&local_278);
    sVar2 = local_228.capacity_;
    local_228.data_ = local_278.data_;
    local_278.data_ = lhs;
    local_228.size_ = local_278.size_;
    local_228.capacity_ = local_278.capacity_;
    local_278.capacity_ = sVar2;
    local_298._0_4_ = 100;
    local_2b8 = (undefined1  [8])
                _Var4._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl;
    local_278.size_ =
         (size_t)_Var4._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
              ((internal *)local_1d8,"vec_moved.size()","100u",(unsigned_long *)local_2b8,
               (uint *)local_298);
    if (local_1d8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_2b8);
      if (local_1d0 == (undefined1  [8])0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = ((_Alloc_hider *)local_1d0)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_298,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
                 ,0x86,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_298,(Message *)local_2b8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_298);
      if (local_2b8 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_2b8 + 8))();
      }
    }
    if (local_1d0 != (undefined1  [8])0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_1d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0);
    }
    local_260._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Var4._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      local_1e0 = lhs + (long)_Var4._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl;
      local_208 = local_158;
      do {
        pTVar1 = local_278.data_;
        if (local_278.size_ <= local_260._M_head_impl) goto LAB_00327489;
        if (lhs == local_278.data_ + (long)local_260._M_head_impl) {
          testing::AssertionSuccess();
        }
        else {
          std::__cxx11::stringstream::stringstream((stringstream *)local_1d8);
          if (lhs == (TagAndArray *)0x0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1d0 + 8),"NULL",4);
          }
          else {
            std::ostream::_M_insert<void_const*>(local_1d0 + 8);
          }
          std::__cxx11::stringbuf::str();
          std::__cxx11::stringstream::~stringstream((stringstream *)local_1d8);
          std::ios_base::~ios_base(local_208);
          std::__cxx11::stringstream::stringstream((stringstream *)local_1d8);
          if (pTVar1 == (TagAndArray *)0x0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1d0 + 8),"NULL",4);
          }
          else {
            std::ostream::_M_insert<void_const*>(local_1d0 + 8);
          }
          std::__cxx11::stringbuf::str();
          std::__cxx11::stringstream::~stringstream((stringstream *)local_1d8);
          std::ios_base::~ios_base(local_208);
          testing::internal::EqFailure
                    (local_238,"&elem","&vec_moved[count]",(string *)local_2b8,(string *)local_298,
                     false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_298._4_4_,local_298._0_4_) != &local_288) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_298._4_4_,local_298._0_4_),
                            local_288._M_allocated_capacity + 1);
          }
          if (local_2b8 != (undefined1  [8])&local_2a8) {
            operator_delete((void *)local_2b8,local_2a8._M_allocated_capacity + 1);
          }
        }
        if (local_238[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_1d8);
          pcVar6 = "";
          if (local_230 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar6 = (local_230->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_2b8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
                     ,0x8a,pcVar6);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_2b8,(Message *)local_1d8)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2b8);
          if (local_1d8 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_1d8 + 8))();
          }
        }
        if (local_230 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_230,local_230);
        }
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                  ((internal *)local_1d8,"elem.tag","count",&lhs->tag,(unsigned_long *)&local_260);
        if (local_1d8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_2b8);
          pcVar6 = "";
          if (local_1d0 != (undefined1  [8])0x0) {
            pcVar6 = ((_Alloc_hider *)local_1d0)->_M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_298,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
                     ,0x8c,pcVar6);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_298,(Message *)local_2b8)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_298);
          if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               )local_2b8 !=
              (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               )0x0) {
            (**(code **)(*(size_type *)local_2b8 + 8))();
          }
        }
        if (local_1d0 != (undefined1  [8])0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_1d0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1d0);
        }
        local_2b8 = (undefined1  [8])(lhs->vec).size_;
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                  ((internal *)local_1d8,"elem.vec.size()","count",(unsigned_long *)local_2b8,
                   (unsigned_long *)&local_260);
        if (local_1d8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_2b8);
          pcVar6 = "";
          if (local_1d0 != (undefined1  [8])0x0) {
            pcVar6 = ((_Alloc_hider *)local_1d0)->_M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_298,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
                     ,0x8d,pcVar6);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_298,(Message *)local_2b8)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_298);
          if (local_2b8 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_2b8 + 8))();
          }
        }
        if (local_1d0 != (undefined1  [8])0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_1d0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1d0);
        }
        local_2b8 = (undefined1  [8])0x0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260._M_head_impl !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          do {
            if ((lhs->vec).size_ <= (ulong)local_2b8) goto LAB_00327489;
            testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                      ((internal *)local_1d8,"elem.vec[j]","j",(lhs->vec).data_ + (long)local_2b8,
                       (unsigned_long *)local_2b8);
            if (local_1d8[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_298);
              pcVar6 = "";
              if (local_1d0 != (undefined1  [8])0x0) {
                pcVar6 = ((_Alloc_hider *)local_1d0)->_M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)local_238,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
                         ,0x8f,pcVar6);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)local_238,(Message *)local_298);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_238);
              if ((long *)CONCAT44(local_298._4_4_,local_298._0_4_) != (long *)0x0) {
                (**(code **)(*(long *)CONCAT44(local_298._4_4_,local_298._0_4_) + 8))();
              }
            }
            if (local_1d0 != (undefined1  [8])0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_1d0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1d0);
            }
            local_2b8 = (undefined1  [8])((long)local_2b8 + 1);
          } while ((ulong)local_2b8 < local_260._M_head_impl);
        }
        local_260._M_head_impl = local_260._M_head_impl + 1;
        lhs = lhs + 1;
      } while (lhs != local_1e0);
    }
    Vector<TagAndArray>::clear(&local_278);
  }
LAB_0032746b:
  OPENSSL_free(local_250.data_);
  local_250.data_ = (unsigned_long *)0x0;
  local_250.size_ = 0;
  local_250.capacity_ = 0;
LAB_00326974:
  Vector<TagAndArray>::clear(&local_228);
  return;
}

Assistant:

TEST(InplaceVectorTest, ComplexType) {
  InplaceVector<std::vector<int>, 4> vec_of_vecs;
  const std::vector<int> data[] = {{1, 2, 3}, {4, 5, 6}, {7, 8, 9}};
  vec_of_vecs.CopyFrom(data);
  EXPECT_EQ(Span(vec_of_vecs), Span(data));

  vec_of_vecs.Resize(2);
  EXPECT_EQ(Span(vec_of_vecs), Span(data, 2));

  vec_of_vecs.PushBack({42});
  EXPECT_EQ(3u, vec_of_vecs.size());
  vec_of_vecs.pop_back();
  EXPECT_EQ(2u, vec_of_vecs.size());

  vec_of_vecs.Resize(4);
  EXPECT_EQ(4u, vec_of_vecs.size());
  EXPECT_EQ(vec_of_vecs[0], data[0]);
  EXPECT_EQ(vec_of_vecs[1], data[1]);
  EXPECT_TRUE(vec_of_vecs[2].empty());
  EXPECT_TRUE(vec_of_vecs[3].empty());

  // Copy-construction.
  InplaceVector<std::vector<int>, 4> vec_of_vecs2 = vec_of_vecs;
  EXPECT_EQ(4u, vec_of_vecs2.size());
  EXPECT_EQ(vec_of_vecs2[0], data[0]);
  EXPECT_EQ(vec_of_vecs2[1], data[1]);
  EXPECT_TRUE(vec_of_vecs2[2].empty());
  EXPECT_TRUE(vec_of_vecs2[3].empty());

  // Copy-assignment.
  InplaceVector<std::vector<int>, 4> vec_of_vecs3;
  vec_of_vecs3 = vec_of_vecs;
  EXPECT_EQ(4u, vec_of_vecs3.size());
  EXPECT_EQ(vec_of_vecs3[0], data[0]);
  EXPECT_EQ(vec_of_vecs3[1], data[1]);
  EXPECT_TRUE(vec_of_vecs3[2].empty());
  EXPECT_TRUE(vec_of_vecs3[3].empty());

  // Move-construction.
  InplaceVector<std::vector<int>, 4> vec_of_vecs4 = std::move(vec_of_vecs);
  EXPECT_EQ(4u, vec_of_vecs4.size());
  EXPECT_EQ(vec_of_vecs4[0], data[0]);
  EXPECT_EQ(vec_of_vecs4[1], data[1]);
  EXPECT_TRUE(vec_of_vecs4[2].empty());
  EXPECT_TRUE(vec_of_vecs4[3].empty());

  // The elements of the original vector should have been moved-from.
  EXPECT_EQ(4u, vec_of_vecs.size());
  for (const auto &vec : vec_of_vecs) {
    EXPECT_TRUE(vec.empty());
  }

  // Move-assignment.
  InplaceVector<std::vector<int>, 4> vec_of_vecs5;
  vec_of_vecs5 = std::move(vec_of_vecs4);
  EXPECT_EQ(4u, vec_of_vecs5.size());
  EXPECT_EQ(vec_of_vecs5[0], data[0]);
  EXPECT_EQ(vec_of_vecs5[1], data[1]);
  EXPECT_TRUE(vec_of_vecs5[2].empty());
  EXPECT_TRUE(vec_of_vecs5[3].empty());

  // The elements of the original vector should have been moved-from.
  EXPECT_EQ(4u, vec_of_vecs4.size());
  for (const auto &vec : vec_of_vecs4) {
    EXPECT_TRUE(vec.empty());
  }

  std::vector<int> v = {42};
  vec_of_vecs5.Resize(3);
  EXPECT_TRUE(vec_of_vecs5.TryPushBack(v));
  EXPECT_EQ(v, vec_of_vecs5[3]);
  EXPECT_FALSE(vec_of_vecs5.TryPushBack(v));
}